

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

size_t __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,size_t index,char *p,size_t count)

{
  Hdr *dst;
  char *__dest;
  size_t sVar1;
  Ptr<void> shadow;
  Ptr<void> local_48;
  Ptr<void> local_38;
  
  if (count == 0) {
    sVar1 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
  }
  else {
    local_38.m_p = (void *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    dst = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_hdr;
    if (((dst != (Hdr *)0x0) && (dst + 1 <= p)) &&
       (p < (char *)((long)&dst[1].super_RefCount._vptr_RefCount + dst->m_bufferSize))) {
      local_48.m_p = (EVP_PKEY_CTX *)0x0;
      local_48.m_refCount = (RefCount *)0x0;
      rc::Ptr<void>::copy(&local_48,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)dst);
      rc::Ptr<void>::copy(&local_38,(EVP_PKEY_CTX *)local_48.m_p,(EVP_PKEY_CTX *)local_48.m_refCount
                         );
      rc::Ptr<void>::clear(&local_48);
    }
    __dest = insertSpace(this,index,count);
    if (__dest == (char *)0x0) {
      sVar1 = 0xffffffffffffffff;
    }
    else {
      if (p != (char *)0x0) {
        memmove(__dest,p,count);
      }
      sVar1 = (this->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
    }
    rc::Ptr<void>::clear(&local_38);
  }
  return sVar1;
}

Assistant:

size_t
	insert(
		size_t index,
		const T* p,
		size_t count
	) {
		if (count == 0)
			return this->m_count;

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			shadow = this->m_hdr; // ensure we keep p intact

		T* dst = insertSpace(index, count);
		if (!dst)
			return -1;

		if (p)
			Details::copy(dst, p, count);

		return this->m_count;
	}